

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O3

_Bool effect_damages(effect *effect)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  effect *effect_00;
  
  if ((effect->index == 0x7a) || (effect->index == 1)) {
    effect_00 = effect->next;
    _Var2 = false;
    iVar3 = dice_evaluate(effect->dice,0,AVERAGE,(random_value *)0x0);
    iVar4 = 1;
    if (0 < iVar3 && effect_00 != (effect *)0x0) {
      do {
        _Var2 = effect_damages(effect_00);
        if (_Var2) {
          return _Var2;
        }
        effect_00 = effect_00->next;
        if (effect_00 == (effect *)0x0) {
          return _Var2;
        }
        bVar1 = iVar4 < iVar3;
        iVar4 = iVar4 + 1;
      } while (bVar1);
    }
  }
  else {
    pcVar5 = effect_info(effect);
    if (pcVar5 == (char *)0x0) {
      _Var2 = false;
    }
    else {
      pcVar5 = effect_info(effect);
      iVar4 = strcmp(pcVar5,"dam");
      _Var2 = iVar4 == 0;
    }
  }
  return _Var2;
}

Assistant:

bool effect_damages(const struct effect *effect)
{
	if (effect->index == EF_RANDOM || effect->index == EF_SELECT) {
		// Random or select effect
		struct effect *e = effect->next;
		int num_subeffects = dice_evaluate(effect->dice, 0, AVERAGE, NULL);

		// Check if any of the subeffects do damage
		for (int i = 0; e != NULL && i < num_subeffects; i++) {
			if (effect_damages(e)) {
				return true;
			}
			e = e->next;
		}
		return false;
	} else {
		// Not a random or select effect, check the info string for
		// damage
		return effect_info(effect) != NULL &&
			streq(effect_info(effect), "dam");
	}
}